

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

int main(void)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  char *__assertion;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint32_t h;
  chck_atlas atlas;
  chck_atlas_rect tr;
  uint32_t w;
  
  cVar1 = chck_atlas(&atlas);
  if (cVar1 == '\0') {
    __assertion = "chck_atlas(&atlas)";
    uVar5 = 0xd;
  }
  else if (atlas.count == 0) {
    iVar2 = chck_atlas_push(&atlas,0x140,0x140);
    if (iVar2 == 0) {
      __assertion = "chck_atlas_push(&atlas, 320, 320)";
      uVar5 = 0x10;
    }
    else if (atlas.count == 1) {
      iVar2 = chck_atlas_pop(&atlas);
      if (iVar2 == 0) {
        if (atlas.count == 0) {
          iVar2 = chck_atlas_push(&atlas,0x140,0x140);
          if (iVar2 == 1) {
            iVar2 = chck_atlas_push(&atlas,0x20);
            if (iVar2 == 2) {
              iVar2 = chck_atlas_push(&atlas,0x20,0x120);
              if (iVar2 == 3) {
                if (atlas.count == 3) {
                  if ((atlas.longest_edge == 0x140) && (atlas.total_area == 0x1b800)) {
                    iVar3 = chck_atlas_pack(&atlas,0,0,&w,&h);
                    iVar2 = iVar3;
                    printf("%ux%u (%u)\n",(ulong)w,(ulong)h);
                    if (((w == 0x160) && (h == 0x140)) && (iVar3 == 0x1b800 - atlas.total_area)) {
                      lVar4 = chck_atlas_get(&atlas,1,&tr);
                      if (lVar4 == 0) {
                        __assertion = "(t = chck_atlas_get(&atlas, 1, &tr))";
                        uVar5 = 0x24;
                      }
                      else {
                        auVar6._0_4_ = -(uint)(tr.x == 0);
                        auVar6._4_4_ = -(uint)(tr.y == 0);
                        auVar6._8_4_ = -(uint)(tr.w == 0x140);
                        auVar6._12_4_ = -(uint)(tr.h == 0x140);
                        uVar5 = movmskps(iVar2,auVar6);
                        uVar5 = uVar5 ^ 0xf;
                        if (uVar5 == 0) {
                          if (((*(char *)(lVar4 + 0x18) == '\0') &&
                              (*(char *)(lVar4 + 0x19) == '\x01')) &&
                             ((*(int *)(lVar4 + 0x14) == 0x140 &&
                              (*(int *)(lVar4 + 0x10) == 0x19000)))) {
                            lVar4 = chck_atlas_get(&atlas,2,&tr);
                            if (lVar4 == 0) {
                              __assertion = "(t = chck_atlas_get(&atlas, 2, &tr))";
                              uVar5 = 0x28;
                            }
                            else {
                              auVar7._0_4_ = -(uint)(tr.x == 0x140);
                              auVar7._4_4_ = -(uint)(tr.y == 0x120);
                              auVar7._8_4_ = -(uint)(tr.w == 0x20);
                              auVar7._12_4_ = -(uint)(tr.h == 0x20);
                              uVar5 = movmskps(uVar5,auVar7);
                              uVar5 = uVar5 ^ 0xf;
                              if (uVar5 == 0) {
                                if (((*(char *)(lVar4 + 0x18) == '\0') &&
                                    (*(char *)(lVar4 + 0x19) == '\x01')) &&
                                   ((*(int *)(lVar4 + 0x14) == 0x20 &&
                                    (*(int *)(lVar4 + 0x10) == 0x400)))) {
                                  lVar4 = chck_atlas_get(&atlas,3,&tr);
                                  if (lVar4 == 0) {
                                    __assertion = "(t = chck_atlas_get(&atlas, 3, &tr))";
                                    uVar5 = 0x2c;
                                  }
                                  else {
                                    auVar8._0_4_ = -(uint)(tr.x == 0x140);
                                    auVar8._4_4_ = -(uint)(tr.y == 0);
                                    auVar8._8_4_ = -(uint)(tr.w == 0x20);
                                    auVar8._12_4_ = -(uint)(tr.h == 0x120);
                                    iVar2 = movmskps(uVar5,auVar8);
                                    if (iVar2 == 0xf) {
                                      if ((((*(char *)(lVar4 + 0x18) == '\0') &&
                                           (*(char *)(lVar4 + 0x19) == '\x01')) &&
                                          (*(int *)(lVar4 + 0x14) == 0x120)) &&
                                         (*(int *)(lVar4 + 0x10) == 0x2400)) {
                                        chck_atlas_release(&atlas);
                                        cVar1 = chck_atlas(&atlas);
                                        if (cVar1 == '\0') {
                                          __assertion = "chck_atlas(&atlas)";
                                          uVar5 = 0x36;
                                        }
                                        else {
                                          iVar2 = chck_atlas_push(&atlas,0x140,0x140);
                                          if (iVar2 == 1) {
                                            iVar2 = chck_atlas_push(&atlas,0x20);
                                            if (iVar2 == 2) {
                                              iVar2 = chck_atlas_push(&atlas,0x20,0x120);
                                              if (iVar2 == 3) {
                                                if ((atlas.count == 3) &&
                                                   (atlas.total_area == 0x1b800)) {
                                                  iVar3 = chck_atlas_pack(&atlas,1,0,&w,&h);
                                                  iVar2 = iVar3;
                                                  printf("%ux%u (%u)\n",(ulong)w,(ulong)h);
                                                  if (((w == 0x200) && (h == 0x200)) &&
                                                     (iVar3 == 0x40000 - atlas.total_area)) {
                                                    lVar4 = chck_atlas_get(&atlas,1,&tr);
                                                    if (lVar4 == 0) {
                                                      __assertion = 
                                                  "(t = chck_atlas_get(&atlas, 1, &tr))";
                                                  uVar5 = 0x43;
                                                  }
                                                  else {
                                                    auVar9._0_4_ = -(uint)(tr.x == 0);
                                                    auVar9._4_4_ = -(uint)(tr.y == 0);
                                                    auVar9._8_4_ = -(uint)(tr.w == 0x140);
                                                    auVar9._12_4_ = -(uint)(tr.h == 0x140);
                                                    uVar5 = movmskps(iVar2,auVar9);
                                                    uVar5 = uVar5 ^ 0xf;
                                                    if (uVar5 == 0) {
                                                      if ((((*(char *)(lVar4 + 0x18) == '\0') &&
                                                           (*(char *)(lVar4 + 0x19) == '\x01')) &&
                                                          (*(int *)(lVar4 + 0x14) == 0x140)) &&
                                                         (*(int *)(lVar4 + 0x10) == 0x19000)) {
                                                        lVar4 = chck_atlas_get(&atlas,2,&tr);
                                                        if (lVar4 == 0) {
                                                          __assertion = 
                                                  "(t = chck_atlas_get(&atlas, 2, &tr))";
                                                  uVar5 = 0x47;
                                                  }
                                                  else {
                                                    auVar10._0_4_ = -(uint)(tr.x == 0x140);
                                                    auVar10._4_4_ = -(uint)(tr.y == 0x120);
                                                    auVar10._8_4_ = -(uint)(tr.w == 0x20);
                                                    auVar10._12_4_ = -(uint)(tr.h == 0x20);
                                                    uVar5 = movmskps(uVar5,auVar10);
                                                    uVar5 = uVar5 ^ 0xf;
                                                    if (uVar5 == 0) {
                                                      if (((*(char *)(lVar4 + 0x18) == '\0') &&
                                                          (*(char *)(lVar4 + 0x19) == '\x01')) &&
                                                         ((*(int *)(lVar4 + 0x14) == 0x20 &&
                                                          (*(int *)(lVar4 + 0x10) == 0x400)))) {
                                                        lVar4 = chck_atlas_get(&atlas,3,&tr);
                                                        if (lVar4 == 0) {
                                                          __assertion = 
                                                  "(t = chck_atlas_get(&atlas, 3, &tr))";
                                                  uVar5 = 0x4b;
                                                  }
                                                  else {
                                                    auVar11._0_4_ = -(uint)(tr.x == 0x140);
                                                    auVar11._4_4_ = -(uint)(tr.y == 0);
                                                    auVar11._8_4_ = -(uint)(tr.w == 0x20);
                                                    auVar11._12_4_ = -(uint)(tr.h == 0x120);
                                                    iVar2 = movmskps(uVar5,auVar11);
                                                    if (iVar2 == 0xf) {
                                                      if (((*(char *)(lVar4 + 0x18) == '\0') &&
                                                          (*(char *)(lVar4 + 0x19) == '\x01')) &&
                                                         ((*(int *)(lVar4 + 0x14) == 0x120 &&
                                                          (*(int *)(lVar4 + 0x10) == 0x2400)))) {
                                                        chck_atlas_release(&atlas);
                                                        return 0;
                                                      }
                                                      __assertion = 
                                                  "!t->flipped && t->placed && t->longest_edge == 288 && t->area == 32 * 288"
                                                  ;
                                                  uVar5 = 0x4d;
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "tr.x == 320 && tr.y == 0 && tr.w == 32 && tr.h == 288"
                                                  ;
                                                  uVar5 = 0x4c;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "!t->flipped && t->placed && t->longest_edge == 32 && t->area == 32 * 32"
                                                  ;
                                                  uVar5 = 0x49;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "tr.x == 320 && tr.y == 288 && tr.w == 32 && tr.h == 32"
                                                  ;
                                                  uVar5 = 0x48;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "!t->flipped && t->placed && t->longest_edge == 320 && t->area == 320 * 320"
                                                  ;
                                                  uVar5 = 0x45;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "tr.x == 0 && tr.y == 0 && tr.w == 320 && tr.h == 320"
                                                  ;
                                                  uVar5 = 0x44;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "w == 512 && h == 512 && free == w * h - atlas.total_area"
                                                  ;
                                                  uVar5 = 0x3f;
                                                  }
                                                }
                                                else {
                                                  __assertion = 
                                                  "atlas.count == 3 && atlas.total_area == 320 * 320 + 32 * 32 + 32 * 288"
                                                  ;
                                                  uVar5 = 0x3a;
                                                }
                                              }
                                              else {
                                                __assertion = 
                                                "chck_atlas_push(&atlas, 32, 288) == 3";
                                                uVar5 = 0x39;
                                              }
                                            }
                                            else {
                                              __assertion = "chck_atlas_push(&atlas, 32, 32) == 2";
                                              uVar5 = 0x38;
                                            }
                                          }
                                          else {
                                            __assertion = "chck_atlas_push(&atlas, 320, 320) == 1";
                                            uVar5 = 0x37;
                                          }
                                        }
                                      }
                                      else {
                                        __assertion = 
                                        "!t->flipped && t->placed && t->longest_edge == 288 && t->area == 32 * 288"
                                        ;
                                        uVar5 = 0x2e;
                                      }
                                    }
                                    else {
                                      __assertion = 
                                      "tr.x == 320 && tr.y == 0 && tr.w == 32 && tr.h == 288";
                                      uVar5 = 0x2d;
                                    }
                                  }
                                }
                                else {
                                  __assertion = 
                                  "!t->flipped && t->placed && t->longest_edge == 32 && t->area == 32 * 32"
                                  ;
                                  uVar5 = 0x2a;
                                }
                              }
                              else {
                                __assertion = 
                                "tr.x == 320 && tr.y == 288 && tr.w == 32 && tr.h == 32";
                                uVar5 = 0x29;
                              }
                            }
                          }
                          else {
                            __assertion = 
                            "!t->flipped && t->placed && t->longest_edge == 320 && t->area == 320 * 320"
                            ;
                            uVar5 = 0x26;
                          }
                        }
                        else {
                          __assertion = "tr.x == 0 && tr.y == 0 && tr.w == 320 && tr.h == 320";
                          uVar5 = 0x25;
                        }
                      }
                    }
                    else {
                      __assertion = "w == 352 && h == 320 && free == w * h - atlas.total_area";
                      uVar5 = 0x20;
                    }
                  }
                  else {
                    __assertion = 
                    "atlas.longest_edge == 320 && atlas.total_area == 320 * 320 + 32 * 32 + 32 * 288"
                    ;
                    uVar5 = 0x1a;
                  }
                }
                else {
                  __assertion = "atlas.count == 3";
                  uVar5 = 0x19;
                }
              }
              else {
                __assertion = "chck_atlas_push(&atlas, 32, 288) == 3";
                uVar5 = 0x18;
              }
            }
            else {
              __assertion = "chck_atlas_push(&atlas, 32, 32) == 2";
              uVar5 = 0x17;
            }
          }
          else {
            __assertion = "chck_atlas_push(&atlas, 320, 320) == 1";
            uVar5 = 0x16;
          }
        }
        else {
          __assertion = "atlas.count == 0";
          uVar5 = 0x14;
        }
      }
      else {
        __assertion = "chck_atlas_pop(&atlas) == 0";
        uVar5 = 0x13;
      }
    }
    else {
      __assertion = "atlas.count == 1";
      uVar5 = 0x11;
    }
  }
  else {
    __assertion = "atlas.count == 0";
    uVar5 = 0xe;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                ,uVar5,"int main(void)");
}

Assistant:

int main(void)
{
   /* TEST: atlas packing */
   {
      struct chck_atlas atlas;
      assert(chck_atlas(&atlas));
      assert(atlas.count == 0);

      assert(chck_atlas_push(&atlas, 320, 320));
      assert(atlas.count == 1);

      assert(chck_atlas_pop(&atlas) == 0);
      assert(atlas.count == 0);

      assert(chck_atlas_push(&atlas, 320, 320) == 1);
      assert(chck_atlas_push(&atlas, 32, 32) == 2);
      assert(chck_atlas_push(&atlas, 32, 288) == 3);
      assert(atlas.count == 3);
      assert(atlas.longest_edge == 320 && atlas.total_area == 320 * 320 + 32 * 32 + 32 * 288);

      uint32_t w, h;
      uint32_t free = chck_atlas_pack(&atlas, false, false, &w, &h);

      printf("%ux%u (%u)\n", w, h, free);
      assert(w == 352 && h == 320 && free == w * h - atlas.total_area);

      struct chck_atlas_rect tr;
      const struct chck_atlas_texture *t;
      assert((t = chck_atlas_get(&atlas, 1, &tr)));
      assert(tr.x == 0 && tr.y == 0 && tr.w == 320 && tr.h == 320);
      assert(!t->flipped && t->placed && t->longest_edge == 320 && t->area == 320 * 320);

      assert((t = chck_atlas_get(&atlas, 2, &tr)));
      assert(tr.x == 320 && tr.y == 288 && tr.w == 32 && tr.h == 32);
      assert(!t->flipped && t->placed && t->longest_edge == 32 && t->area == 32 * 32);

      assert((t = chck_atlas_get(&atlas, 3, &tr)));
      assert(tr.x == 320 && tr.y == 0 && tr.w == 32 && tr.h == 288);
      assert(!t->flipped && t->placed && t->longest_edge == 288 && t->area == 32 * 288);

      chck_atlas_release(&atlas);
   }

   /* TEST: atlas packing (forced pot) */
   {
      struct chck_atlas atlas;
      assert(chck_atlas(&atlas));
      assert(chck_atlas_push(&atlas, 320, 320) == 1);
      assert(chck_atlas_push(&atlas, 32, 32) == 2);
      assert(chck_atlas_push(&atlas, 32, 288) == 3);
      assert(atlas.count == 3 && atlas.total_area == 320 * 320 + 32 * 32 + 32 * 288);

      uint32_t w, h;
      uint32_t free = chck_atlas_pack(&atlas, true, false, &w, &h);
      printf("%ux%u (%u)\n", w, h, free);
      assert(w == 512 && h == 512 && free == w * h - atlas.total_area);

      struct chck_atlas_rect tr;
      const struct chck_atlas_texture *t;
      assert((t = chck_atlas_get(&atlas, 1, &tr)));
      assert(tr.x == 0 && tr.y == 0 && tr.w == 320 && tr.h == 320);
      assert(!t->flipped && t->placed && t->longest_edge == 320 && t->area == 320 * 320);

      assert((t = chck_atlas_get(&atlas, 2, &tr)));
      assert(tr.x == 320 && tr.y == 288 && tr.w == 32 && tr.h == 32);
      assert(!t->flipped && t->placed && t->longest_edge == 32 && t->area == 32 * 32);

      assert((t = chck_atlas_get(&atlas, 3, &tr)));
      assert(tr.x == 320 && tr.y == 0 && tr.w == 32 && tr.h == 288);
      assert(!t->flipped && t->placed && t->longest_edge == 288 && t->area == 32 * 288);

      chck_atlas_release(&atlas);
   }

   return EXIT_SUCCESS;
}